

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::DrawLog(DBaseStatusBar *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  FBrokenLines *lines;
  FBrokenLines *pFVar7;
  FBrokenLines *pFVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  
  if (*(int *)((this->CPlayer->LogText).Chars + -0xc) == 0) {
    return;
  }
  iVar3 = active_con_scaletext();
  iVar6 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  if (iVar3 == 0) {
    uVar5 = (screen->super_DSimpleCanvas).super_DCanvas.Height / CleanYfac;
    iVar3 = CleanXfac;
  }
  else {
    iVar3 = active_con_scaletext();
    iVar11 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    iVar4 = active_con_scaletext();
    uVar5 = iVar11 / iVar4;
  }
  uVar1 = (long)iVar6 / (long)iVar3;
  iVar6 = (int)uVar1;
  iVar3 = 0x230;
  lVar14 = (long)iVar6;
  if (iVar6 < 0x280) {
    auVar2 = SEXT816(lVar14 * 9) * SEXT816(0x6666666666666667);
    iVar3 = ((int)(auVar2._8_8_ >> 2) - (auVar2._12_4_ >> 0x1f)) + -0x28;
  }
  lines = V_BreakLines(SmallFont,iVar3,(BYTE *)(this->CPlayer->LogText).Chars,false);
  if (lines->Width == -1) {
    iVar11 = 0x14;
  }
  else {
    iVar11 = 0x14;
    pFVar7 = lines;
    do {
      pFVar7 = pFVar7 + 1;
      iVar11 = iVar11 + SmallFont->FontHeight + 1;
    } while (pFVar7->Width != -1);
  }
  if (iVar3 < 0x230) {
    iVar3 = iVar6 / 0x14;
    uVar13 = uVar5 + 7;
    if (-1 < (int)uVar5) {
      uVar13 = uVar5;
    }
    iVar4 = (int)uVar13 >> 3;
    lVar9 = (long)(iVar6 + iVar3 * -2);
  }
  else {
    iVar3 = (iVar6 >> 1) + -300;
    iVar6 = (int)(uVar5 * 3) / 10 - (iVar11 >> 1);
    iVar4 = 0;
    if (0 < iVar6) {
      iVar4 = iVar6;
    }
    lVar9 = 600;
  }
  lVar10 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Width;
  lVar12 = (long)(screen->super_DSimpleCanvas).super_DCanvas.Height;
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
            (0x3f000000,screen,0,(iVar3 * lVar10) / lVar14 & 0xffffffff,
             (iVar4 * lVar12) / (long)(int)uVar5 & 0xffffffff,(lVar9 * lVar10) / lVar14 & 0xffffffff
             ,(iVar11 * lVar12) / (long)(int)uVar5 & 0xffffffff);
  if (lines->Width != -1) {
    iVar4 = iVar4 + 10;
    pFVar7 = lines;
    do {
      pFVar8 = pFVar7 + 1;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,0xb,iVar3 + 0x14,iVar4,(pFVar7->Text).Chars,
                        0x400013a8,1,0x40001399,uVar1 & 0xffffffff,0x4000139a,(ulong)uVar5,0);
      iVar4 = iVar4 + SmallFont->FontHeight + 1;
      pFVar7 = pFVar8;
    } while (pFVar8->Width != -1);
  }
  V_FreeBrokenLines(lines);
  return;
}

Assistant:

void DBaseStatusBar::DrawLog ()
{
	int hudwidth, hudheight;

	if (CPlayer->LogText.IsNotEmpty())
	{
		// This uses the same scaling as regular HUD messages
		if (active_con_scaletext() == 0)
		{
			hudwidth = SCREENWIDTH / CleanXfac;
			hudheight = SCREENHEIGHT / CleanYfac;
		}
		else
		{
			hudwidth = SCREENWIDTH / active_con_scaletext();
			hudheight = SCREENHEIGHT / active_con_scaletext();
		}

		int linelen = hudwidth<640? Scale(hudwidth,9,10)-40 : 560;
		FBrokenLines *lines = V_BreakLines (SmallFont, linelen, CPlayer->LogText);
		int height = 20;

		for (int i = 0; lines[i].Width != -1; i++) height += SmallFont->GetHeight () + 1;

		int x,y,w;

		if (linelen<560)
		{
			x=hudwidth/20;
			y=hudheight/8;
			w=hudwidth-2*x;
		}
		else
		{
			x=(hudwidth>>1)-300;
			y=hudheight*3/10-(height>>1);
			if (y<0) y=0;
			w=600;
		}
		screen->Dim(0, 0.5f, Scale(x, SCREENWIDTH, hudwidth), Scale(y, SCREENHEIGHT, hudheight), 
							 Scale(w, SCREENWIDTH, hudwidth), Scale(height, SCREENHEIGHT, hudheight));
		x+=20;
		y+=10;
		for (int i = 0; lines[i].Width != -1; i++)
		{

			screen->DrawText (SmallFont, CR_UNTRANSLATED, x, y, lines[i].Text,
				DTA_KeepRatio, true,
				DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, TAG_DONE);
			y += SmallFont->GetHeight ()+1;
		}

		V_FreeBrokenLines (lines);
	}
}